

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

int skipcomment(LoadF *lf,int *cp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  lf->n = 0;
  iVar2 = 0;
  lVar4 = 0;
  do {
    uVar1 = getc((FILE *)lf->f);
    if (uVar1 == 0xffffffff) {
      iVar3 = -1;
      goto LAB_00107fd0;
    }
    if (uVar1 != (byte)anon_var_dwarf_531b[lVar4]) goto LAB_00107f9d;
    lVar4 = lVar4 + 1;
    iVar3 = lf->n;
    lf->n = iVar3 + 1;
    lf->buff[iVar3] = (char)uVar1;
  } while (lVar4 != 3);
  lf->n = 0;
  uVar1 = getc((FILE *)lf->f);
LAB_00107f9d:
  *cp = uVar1;
  iVar2 = 0;
  if (uVar1 == 0x23) {
    do {
      iVar2 = getc((FILE *)lf->f);
      if (iVar2 == 10) break;
    } while (iVar2 != -1);
    iVar3 = getc((FILE *)lf->f);
    iVar2 = 1;
LAB_00107fd0:
    *cp = iVar3;
  }
  return iVar2;
}

Assistant:

static int skipcomment(LoadF *lf, int *cp) {
    int c = *cp = skipBOM(lf);
    if (c == '#') {  /* first line is a comment (Unix exec. file)? */
        do {  /* skip first line */
            c = getc(lf->f);
        } while (c != EOF && c != '\n');
        *cp = getc(lf->f);  /* skip end-of-line, if present */
        return 1;  /* there was a comment */
    } else return 0;  /* no comment */
}